

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O1

void plutovg_color_init_rgba(plutovg_color_t *color,float r,float g,float b,float a)

{
  float fVar1;
  
  fVar1 = 1.0;
  if (r <= 1.0) {
    fVar1 = r;
  }
  color->r = (float)(~-(uint)(r < 0.0) & (uint)fVar1);
  fVar1 = 1.0;
  if (g <= 1.0) {
    fVar1 = g;
  }
  color->g = (float)(~-(uint)(g < 0.0) & (uint)fVar1);
  fVar1 = 1.0;
  if (b <= 1.0) {
    fVar1 = b;
  }
  color->b = (float)(~-(uint)(b < 0.0) & (uint)fVar1);
  fVar1 = 1.0;
  if (a <= 1.0) {
    fVar1 = a;
  }
  color->a = (float)(~-(uint)(a < 0.0) & (uint)fVar1);
  return;
}

Assistant:

void plutovg_color_init_rgba(plutovg_color_t* color, float r, float g, float b, float a)
{
    color->r = plutovg_clamp(r, 0.f, 1.f);
    color->g = plutovg_clamp(g, 0.f, 1.f);
    color->b = plutovg_clamp(b, 0.f, 1.f);
    color->a = plutovg_clamp(a, 0.f, 1.f);
}